

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O1

int AF_AActor_SpawnTeleportFog
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *mobj;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *pcVar4;
  bool bVar5;
  DVector3 local_38;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      mobj = (AActor *)(param->field_0).field_1.a;
      if (mobj != (AActor *)0x0) {
        if ((mobj->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(mobj->super_DThinker).super_DObject._vptr_DObject)(mobj);
          (mobj->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (mobj->super_DThinker).super_DObject.Class;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0045a7c5;
        }
      }
      if (numparam == 1) {
        pcVar4 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if (numparam < 3) {
            pcVar4 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar4 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  if (numparam < 5) {
                    pcVar4 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\0') {
                      if (numparam == 5) {
                        pcVar4 = "(paramnum) < numparam";
                      }
                      else {
                        if (param[5].field_0.field_3.Type == '\0') {
                          local_38.X = (double)param[1].field_0.field_1.a;
                          local_38.Y = (double)param[2].field_0.field_1.a;
                          local_38.Z = (double)param[3].field_0.field_1.a;
                          P_SpawnTeleportFog(mobj,&local_38,param[4].field_0.i != 0,
                                             param[5].field_0.i != 0);
                          return 0;
                        }
                        pcVar4 = "param[paramnum].Type == REGT_INT";
                      }
                      __assert_fail(pcVar4,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                                    ,0x6a,
                                    "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar4 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar4,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                                ,0x69,
                                "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar4 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                            ,0x68,
                            "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar4 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                        ,0x67,
                        "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar4 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                    ,0x66,
                    "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0045a7c5:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                ,0x65,
                "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnTeleportFog)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL(before);
	PARAM_BOOL(settarget);
	P_SpawnTeleportFog(self, DVector3(x, y, z), before, settarget);
	return 0;
}